

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.cpp
# Opt level: O1

vector<int,_std::allocator<int>_> *
despot::Variable::ComputeIndexVec
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,
          vector<despot::StateVar_*,_std::allocator<despot::StateVar_*>_> *vars,int index)

{
  pointer piVar1;
  long lVar2;
  bool bVar3;
  uint uVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  allocator_type local_19;
  
  std::vector<int,_std::allocator<int>_>::vector
            (__return_storage_ptr__,*(long *)(vars + 8) - *(long *)vars >> 3,&local_19);
  piVar1 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar4 = (int)((ulong)((long)(__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)piVar1) >> 2) - 1;
  if (-1 < (int)uVar4) {
    lVar2 = *(long *)vars;
    lVar5 = (ulong)uVar4 + 1;
    do {
      lVar6 = *(long *)(lVar2 + -8 + lVar5 * 8);
      iVar7 = (int)((ulong)(*(long *)(lVar6 + 0x10) - *(long *)(lVar6 + 8)) >> 5);
      piVar1[lVar5 + -1] = index % iVar7;
      lVar6 = lVar5 + -1;
      bVar3 = 0 < lVar5;
      lVar5 = lVar6;
      index = index / iVar7;
    } while (lVar6 != 0 && bVar3);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<int> Variable::ComputeIndexVec(const vector<StateVar*>& vars,
	int index) {
	vector<int> vec(vars.size());
	for (int i = vec.size() - 1; i >= 0; i--) {
		vec[i] = index % vars[i]->Size();
		index /= vars[i]->Size();
	}

	return vec;
}